

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

int NULLC::CompareObjects(NULLCRef l,NULLCRef r)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *__function;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_0000001c;
  
  if (in_stack_00000008 == l.ptr._4_4_) {
    if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
      iVar3 = bcmp((void *)CONCAT44(l.typeID,in_stack_0000000c),
                   (void *)CONCAT44(r.typeID,in_stack_0000001c),
                   (ulong)*(uint *)(*(long *)(linker + 0x200) + 4 + (ulong)in_stack_00000008 * 0x50)
                  );
      return (uint)(iVar3 == 0);
    }
  }
  else if (l.ptr._4_4_ < *(uint *)(linker + 0x20c)) {
    uVar1 = *(uint *)(*(long *)(linker + 0x200) + (ulong)l.ptr._4_4_ * 0x50);
    if (uVar1 < *(uint *)(linker + 0x29c)) {
      if (*(uint *)(linker + 0x20c) <= in_stack_00000008) goto LAB_0011f11a;
      uVar2 = *(uint *)(*(long *)(linker + 0x200) + (ulong)in_stack_00000008 * 0x50);
      if (uVar2 < *(uint *)(linker + 0x29c)) {
        nullcThrowError("ERROR: types don\'t match (%s ref, %s ref)",
                        (ulong)uVar1 + *(long *)(linker + 0x290),
                        (ulong)uVar2 + *(long *)(linker + 0x290));
        return 0;
      }
    }
    __function = 
    "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
    ;
    goto LAB_0011f146;
  }
LAB_0011f11a:
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_0011f146:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,__function);
}

Assistant:

int NULLC::CompareObjects(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: types don't match (%s ref, %s ref)", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return 0;
	}
	return 0 == memcmp(l.ptr, r.ptr, linker->exTypes[l.typeID].size);
}